

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZydisFuzzEncoder.c
# Opt level: O0

void ZydisCompareRequestToInstruction
               (ZydisEncoderRequest *request,ZydisDecodedInstruction *insn,
               ZydisDecodedOperand *operands,ZyanU8 *insn_bytes)

{
  ZydisRegister ZVar1;
  ZyanStatus ZVar2;
  ulong uVar3;
  bool bVar4;
  ZyanU64 mask;
  ZyanU64 ZStack_4e0;
  ZyanBool acceptable_mismatch_1;
  ZyanU64 addr;
  ZydisDecodedOperand *pZStack_4d0;
  ZyanBool acceptable_mismatch;
  ZydisDecodedOperand *op2;
  ZydisEncoderOperand *op1;
  ulong uStack_4b8;
  ZyanU8 i;
  ZyanU64 acceptable_prefixes;
  ZydisStackWidth local_4a8;
  undefined1 local_4a4 [3];
  ZyanBool prefixes_match;
  ZydisStackWidth stack_width;
  ZydisDecoder decoder;
  ZydisDecodedOperand knc_operands [10];
  undefined1 local_170 [8];
  ZydisDecodedInstruction knc_insn;
  ZyanU8 *insn_bytes_local;
  ZydisDecodedOperand *operands_local;
  ZydisDecodedInstruction *insn_local;
  ZydisEncoderRequest *request_local;
  
  if (((((request->mnemonic != ZYDIS_MNEMONIC_XCHG) || (request->operand_count != '\x02')) ||
       (request->operands[0].type != ZYDIS_OPERAND_TYPE_REGISTER)) ||
      (((request->operands[1].type != ZYDIS_OPERAND_TYPE_REGISTER ||
        (request->operands[0].reg.value != request->operands[1].reg.value)) ||
       (insn->mnemonic != ZYDIS_MNEMONIC_NOP)))) ||
     (((ZVar1 = request->operands[0].reg.value, ZVar1 != ZYDIS_REGISTER_AX &&
       (ZVar1 != ZYDIS_REGISTER_EAX)) && (ZVar1 != ZYDIS_REGISTER_RAX)))) {
    knc_insn.raw.imm[1]._16_8_ = insn_bytes;
    insn_bytes_local = &operands->id;
    operands_local = (ZydisDecodedOperand *)insn;
    if (request->mnemonic != insn->mnemonic) {
      local_4a8 = (int)(uint)insn->stack_width >> 5;
      ZVar2 = ZydisDecoderInit((ZydisDecoder *)local_4a4,insn->machine_mode,local_4a8);
      if ((ZVar2 & 0x80000000) != 0) {
        fputs("Failed to initialize decoder\n",_stderr);
        abort();
      }
      ZVar2 = ZydisDecoderEnableMode((ZydisDecoder *)local_4a4,ZYDIS_DECODER_MODE_KNC,'\x01');
      if ((ZVar2 & 0x80000000) != 0) {
        fputs("Failed to enable KNC mode\n",_stderr);
        abort();
      }
      ZVar2 = ZydisDecoderDecodeFull
                        ((ZydisDecoder *)local_4a4,(void *)knc_insn.raw.imm[1]._16_8_,
                         (ulong)insn->length,(ZydisDecodedInstruction *)local_170,
                         (ZydisDecodedOperand *)&decoder.stack_width);
      if ((ZVar2 & 0x80000000) != 0) {
        fputs("Failed to decode instruction\n",_stderr);
        abort();
      }
      operands_local = (ZydisDecodedOperand *)local_170;
      insn_bytes_local = (ZyanU8 *)&decoder.stack_width;
    }
    acceptable_prefixes._7_1_ =
         (*(ulong *)&operands_local->type & request->prefixes) == request->prefixes;
    if (((!(bool)acceptable_prefixes._7_1_) && (request->machine_mode != ZYDIS_MACHINE_MODE_LONG_64)
        ) && ((request->prefixes & 0x8000000000) != 0)) {
      uStack_4b8 = request->prefixes & 0xffffff7fffffffff | 0x1000000000;
      acceptable_prefixes._7_1_ = (*(ulong *)&operands_local->type & uStack_4b8) == uStack_4b8;
    }
    if (((request->machine_mode != *(ZydisMachineMode *)operands_local) ||
        (request->mnemonic != operands_local->visibility)) ||
       ((request->operand_count != *(ZyanU8 *)((long)&operands_local->element_size + 1) ||
        ((bool)acceptable_prefixes._7_1_ == false)))) {
      fputs("Basic instruction attributes mismatch\n",_stderr);
      abort();
    }
    for (op1._7_1_ = 0; op1._7_1_ < *(byte *)((long)&operands_local->element_size + 1);
        op1._7_1_ = op1._7_1_ + 1) {
      op2 = (ZydisDecodedOperand *)(request->operands + op1._7_1_);
      pZStack_4d0 = (ZydisDecodedOperand *)(insn_bytes_local + (ulong)op1._7_1_ * 0x50);
      if (*(ZydisOperandType *)op2 != pZStack_4d0->type) {
        fprintf(_stderr,"Mismatch for operand %u\n",(ulong)op1._7_1_);
        abort();
      }
      switch(*(ZydisOperandType *)op2) {
      case ZYDIS_OPERAND_TYPE_REGISTER:
        if (((ZydisEncoderOperandReg_ *)&op2->visibility)->value != (pZStack_4d0->field_10).mem.type
           ) {
          fprintf(_stderr,"Mismatch for register operand %u\n",(ulong)op1._7_1_);
          abort();
        }
        break;
      case ZYDIS_OPERAND_TYPE_MEMORY:
        if ((((((ZydisEncoderOperandMem_ *)&op2->size)->base != (pZStack_4d0->field_10).mem.base) ||
             (op2->element_type != (pZStack_4d0->field_10).mem.index)) ||
            (((ZyanU8)op2->element_size != (pZStack_4d0->field_10).mem.scale &&
             ((pZStack_4d0->field_10).mem.type != ZYDIS_MEMOP_TYPE_MIB)))) ||
           (*(long *)&op2->type != (pZStack_4d0->field_10).mem.disp.value)) {
          addr._7_1_ = false;
          if (*(long *)&op2->type != (pZStack_4d0->field_10).mem.disp.value) {
            if (((*(char *)((long)&pZStack_4d0->field_10 + 0x21) != '\0') &&
                (op2->element_type == ZYDIS_ELEMENT_TYPE_INVALID)) &&
               ((((ZydisEncoderOperandMem_ *)&op2->size)->base == ZYDIS_REGISTER_NONE ||
                ((((ZydisEncoderOperandMem_ *)&op2->size)->base == ZYDIS_REGISTER_EIP ||
                 (((ZydisEncoderOperandMem_ *)&op2->size)->base == ZYDIS_REGISTER_RIP)))))) {
              ZydisCalcAbsoluteAddress
                        ((ZydisDecodedInstruction *)operands_local,pZStack_4d0,0,
                         &stack0xfffffffffffffb20);
              addr._7_1_ = *(ZyanU64 *)&op2->type == ZStack_4e0;
            }
            if ((((*(int *)operands_local == 5) || (*(int *)operands_local == 4)) ||
                (*(int *)operands_local == 2)) ||
               ((*(byte *)((long)&operands_local->element_type + 1) == 0x10 ||
                (*(byte *)((long)&operands_local->element_type + 3) == 0x10)))) {
              addr._7_1_ = (*(ulong *)&op2->type & 0xffff) ==
                           ((pZStack_4d0->field_10).mem.disp.value & 0xffffU);
            }
          }
          if ((bool)addr._7_1_ == false) {
            fprintf(_stderr,"Mismatch for memory operand %u\n",(ulong)op1._7_1_);
            abort();
          }
        }
        break;
      case ZYDIS_OPERAND_TYPE_POINTER:
        if (((short)(op2->field_10).mem.base != (pZStack_4d0->field_10).ptr.segment) ||
           ((op2->field_10).mem.index != (pZStack_4d0->field_10).mem.segment)) {
          fprintf(_stderr,"Mismatch for pointer operand %u\n",(ulong)op1._7_1_);
          abort();
        }
        break;
      case ZYDIS_OPERAND_TYPE_IMMEDIATE:
        if (*(ZyanU64 *)((long)&op2->field_10 + 0x10) != (pZStack_4d0->field_10).imm.value.u) {
          bVar4 = false;
          if ((operands_local[1].encoding == ZYDIS_OPERAND_ENCODING_JIMM16_32_64) ||
             (operands_local[1].encoding ==
              (ZYDIS_OPERAND_ENCODING_JIMM16_32_64|ZYDIS_OPERAND_ENCODING_SIMM64))) {
            if (pZStack_4d0->size < 0x40) {
              uVar3 = (1L << ((byte)pZStack_4d0->size & 0x3f)) - 1;
              bVar4 = (*(ulong *)((long)&op2->field_10 + 0x10) & uVar3) ==
                      ((pZStack_4d0->field_10).imm.value.u & uVar3);
            }
            else {
              bVar4 = *(ZyanU64 *)((long)&op2->field_10 + 0x10) ==
                      (pZStack_4d0->field_10).imm.value.u;
            }
          }
          if (!bVar4) {
            fprintf(_stderr,"Mismatch for immediate operand %u\n",(ulong)op1._7_1_);
            abort();
          }
        }
        break;
      default:
        fprintf(_stderr,"Invalid operand type for operand %u\n",(ulong)op1._7_1_);
        abort();
      }
    }
  }
  return;
}

Assistant:

void ZydisCompareRequestToInstruction(const ZydisEncoderRequest *request,
    const ZydisDecodedInstruction *insn, const ZydisDecodedOperand* operands, const ZyanU8 *insn_bytes)
{
    // Special case, `xchg rAX, rAX` is an alias for `NOP`
    if ((request->mnemonic == ZYDIS_MNEMONIC_XCHG) &&
        (request->operand_count == 2) &&
        (request->operands[0].type == ZYDIS_OPERAND_TYPE_REGISTER) &&
        (request->operands[1].type == ZYDIS_OPERAND_TYPE_REGISTER) &&
        (request->operands[0].reg.value == request->operands[1].reg.value) &&
        (insn->mnemonic == ZYDIS_MNEMONIC_NOP))
    {
        switch (request->operands[0].reg.value)
        {
        case ZYDIS_REGISTER_AX:
        case ZYDIS_REGISTER_EAX:
        case ZYDIS_REGISTER_RAX:
            return;
        default:
            break;
        }
    }

    // Handle possible KNC overlap
    ZydisDecodedInstruction knc_insn;
    ZydisDecodedOperand knc_operands[ZYDIS_MAX_OPERAND_COUNT];
    if (request->mnemonic != insn->mnemonic)
    {
        ZydisDecoder decoder;
        ZydisStackWidth stack_width = (ZydisStackWidth)(insn->stack_width >> 5);
        if (!ZYAN_SUCCESS(ZydisDecoderInit(&decoder, insn->machine_mode, stack_width)))
        {
            fputs("Failed to initialize decoder\n", ZYAN_STDERR);
            abort();
        }
        if (!ZYAN_SUCCESS(ZydisDecoderEnableMode(&decoder, ZYDIS_DECODER_MODE_KNC, ZYAN_TRUE)))
        {
            fputs("Failed to enable KNC mode\n", ZYAN_STDERR);
            abort();
        }
        if (!ZYAN_SUCCESS(ZydisDecoderDecodeFull(&decoder, insn_bytes, insn->length, &knc_insn,
            knc_operands)))
        {
            fputs("Failed to decode instruction\n", ZYAN_STDERR);
            abort();
        }
        insn = &knc_insn;
        operands = knc_operands;
    }

    ZyanBool prefixes_match = ((insn->attributes & request->prefixes) == request->prefixes);
    if (!prefixes_match &&
        (request->machine_mode != ZYDIS_MACHINE_MODE_LONG_64) &&
        (request->prefixes & ZYDIS_ATTRIB_HAS_SEGMENT_DS))
    {
        // Encoder allows specifying DS override even when it might be interpreted as NOTRACK
        ZyanU64 acceptable_prefixes = (request->prefixes & (~ZYDIS_ATTRIB_HAS_SEGMENT_DS)) |
                                      ZYDIS_ATTRIB_HAS_NOTRACK;
        prefixes_match = ((insn->attributes & acceptable_prefixes) == acceptable_prefixes);
    }
    if ((request->machine_mode != insn->machine_mode) ||
        (request->mnemonic != insn->mnemonic) ||
        (request->operand_count != insn->operand_count_visible) ||
        !prefixes_match)
    {
        fputs("Basic instruction attributes mismatch\n", ZYAN_STDERR);
        abort();
    }

    for (ZyanU8 i = 0; i < insn->operand_count_visible; ++i)
    {
        const ZydisEncoderOperand *op1 = &request->operands[i];
        const ZydisDecodedOperand *op2 = &operands[i];
        if (op1->type != op2->type)
        {
            fprintf(ZYAN_STDERR, "Mismatch for operand %u\n", i);
            abort();
        }
        switch (op1->type)
        {
        case ZYDIS_OPERAND_TYPE_REGISTER:
            if (op1->reg.value != op2->reg.value)
            {
                fprintf(ZYAN_STDERR, "Mismatch for register operand %u\n", i);
                abort();
            }
            break;
        case ZYDIS_OPERAND_TYPE_MEMORY:
            if ((op1->mem.base != op2->mem.base) ||
                (op1->mem.index != op2->mem.index) ||
                (op1->mem.scale != op2->mem.scale && op2->mem.type != ZYDIS_MEMOP_TYPE_MIB) ||
                (op1->mem.displacement != op2->mem.disp.value))
            {
                ZyanBool acceptable_mismatch = ZYAN_FALSE;
                if (op1->mem.displacement != op2->mem.disp.value)
                {
                    if ((op2->mem.disp.size) &&
                        (op1->mem.index == ZYDIS_REGISTER_NONE) &&
                        ((op1->mem.base == ZYDIS_REGISTER_NONE) ||
                         (op1->mem.base == ZYDIS_REGISTER_EIP) ||
                         (op1->mem.base == ZYDIS_REGISTER_RIP)))
                    {
                        ZyanU64 addr;
                        ZydisCalcAbsoluteAddress(insn, op2, 0, &addr);
                        acceptable_mismatch = ((ZyanU64)op1->mem.displacement == addr);
                    }
                    if ((insn->machine_mode == ZYDIS_MACHINE_MODE_REAL_16) ||
                        (insn->machine_mode == ZYDIS_MACHINE_MODE_LEGACY_16) ||
                        (insn->machine_mode == ZYDIS_MACHINE_MODE_LONG_COMPAT_16) ||
                        (insn->stack_width == 16) ||
                        (insn->address_width == 16))
                    {
                        acceptable_mismatch = ((op1->mem.displacement & 0xFFFF) ==
                            (op2->mem.disp.value & 0xFFFF));
                    }
                }
                if (!acceptable_mismatch)
                {
                    fprintf(ZYAN_STDERR, "Mismatch for memory operand %u\n", i);
                    abort();
                }
            }
            break;
        case ZYDIS_OPERAND_TYPE_POINTER:
            if ((op1->ptr.segment != op2->ptr.segment) ||
                (op1->ptr.offset != op2->ptr.offset))
            {
                fprintf(ZYAN_STDERR, "Mismatch for pointer operand %u\n", i);
                abort();
            }
            break;
        case ZYDIS_OPERAND_TYPE_IMMEDIATE:
            if (op1->imm.u != op2->imm.value.u)
            {
                ZyanBool acceptable_mismatch = ZYAN_FALSE;
                if ((insn->meta.category == ZYDIS_CATEGORY_DATAXFER) ||
                    (insn->meta.category == ZYDIS_CATEGORY_LOGICAL))
                {
                    if (op2->size < 64)
                    {
                        ZyanU64 mask = (1ULL << op2->size) - 1;
                        acceptable_mismatch =
                            (op1->imm.u & mask) == (op2->imm.value.u & mask);
                    }
                    else
                    {
                        acceptable_mismatch = op1->imm.u == op2->imm.value.u;
                    }
                }
                if (!acceptable_mismatch)
                {
                    fprintf(ZYAN_STDERR, "Mismatch for immediate operand %u\n", i);
                    abort();
                }
            }
            break;
        default:
            fprintf(ZYAN_STDERR, "Invalid operand type for operand %u\n", i);
            abort();
        }
    }
}